

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

bool __thiscall
testing::internal::FloatingPoint<float>::AlmostEquals
          (FloatingPoint<float> *this,FloatingPoint<float> *rhs)

{
  long lVar1;
  bool bVar2;
  Bits BVar3;
  long in_FS_OFFSET;
  FloatingPoint<float> *rhs_local;
  FloatingPoint<float> *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = is_nan(this);
  if (!bVar2) {
    bVar2 = is_nan(rhs);
    if (!bVar2) {
      BVar3 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)this,(Bits *)rhs);
      this_local._7_1_ = BVar3 < 5;
      goto LAB_001d894e;
    }
  }
  this_local._7_1_ = false;
LAB_001d894e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }